

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bitwidth_t __thiscall slang::ast::Type::getBitWidth(Type *this)

{
  bool bVar1;
  SymbolKind SVar2;
  Type *this_00;
  Type *pTVar3;
  ulong uVar4;
  
  this_00 = getCanonicalType(this);
  pTVar3 = getCanonicalType(this_00);
  bVar1 = IntegralType::isKind((pTVar3->super_Symbol).kind);
  if (bVar1) {
    SVar2 = this_00[1].super_Symbol.kind;
  }
  else {
    pTVar3 = getCanonicalType(this_00);
    SVar2 = Unknown;
    if (((pTVar3->super_Symbol).kind == FloatingType) &&
       (uVar4 = (ulong)this_00[1].super_Symbol.kind, uVar4 < 3)) {
      SVar2 = *(SymbolKind *)(&DAT_0054c750 + uVar4 * 4);
    }
  }
  return SVar2;
}

Assistant:

bitwidth_t Type::getBitWidth() const {
    const Type& ct = getCanonicalType();
    if (ct.isIntegral())
        return ct.as<IntegralType>().bitWidth;

    if (ct.isFloating()) {
        switch (ct.as<FloatingType>().floatKind) {
            case FloatingType::Real:
                return 64;
            case FloatingType::RealTime:
                return 64;
            case FloatingType::ShortReal:
                return 32;
        }
    }
    return 0;
}